

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

int __thiscall S2Polygon::GetParent(S2Polygon *this,int k)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  S2Loop *pSVar4;
  int local_1c;
  int depth;
  int k_local;
  S2Polygon *this_local;
  
  pSVar4 = loop(this,k);
  iVar2 = S2Loop::depth(pSVar4);
  local_1c = k;
  if (iVar2 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    do {
      local_1c = local_1c + -1;
      bVar1 = false;
      if (-1 < local_1c) {
        pSVar4 = loop(this,local_1c);
        iVar3 = S2Loop::depth(pSVar4);
        bVar1 = iVar2 <= iVar3;
      }
      this_local._4_4_ = local_1c;
    } while (bVar1);
  }
  return this_local._4_4_;
}

Assistant:

int S2Polygon::GetParent(int k) const {
  int depth = loop(k)->depth();
  if (depth == 0) return -1;  // Optimization.
  while (--k >= 0 && loop(k)->depth() >= depth) continue;
  return k;
}